

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O1

uint32_t __thiscall
cfd::ConfidentialTransactionController::GetSizeIgnoreTxIn
          (ConfidentialTransactionController *this,bool is_blinded,uint32_t *witness_area_size,
          uint32_t *no_witness_area_size,int exponent,int minimum_bits)

{
  byte bVar1;
  char cVar2;
  undefined7 in_register_00000031;
  ConfidentialTxOutReference *txout;
  long lVar3;
  int iVar4;
  int iVar5;
  uint32_t temp_no_witness_size;
  undefined4 local_94;
  int local_90;
  uint local_8c;
  uint32_t temp_witness_size;
  undefined4 uStack_84;
  uint32_t *local_70;
  uint32_t *local_68;
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  txins;
  long local_58;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  txouts;
  long local_40;
  
  local_94 = (undefined4)CONCAT71(in_register_00000031,is_blinded);
  local_90 = exponent;
  local_8c = minimum_bits;
  local_70 = witness_area_size;
  local_68 = no_witness_area_size;
  cfd::core::ConfidentialTransaction::GetTxOutList();
  cfd::core::ConfidentialTransaction::GetTxInList();
  iVar5 = 0;
  if (_txins != local_58) {
    lVar3 = _txins;
    do {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&temp_witness_size,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(lVar3 + 0xa8));
      cVar2 = cfd::core::ByteData256::IsEmpty();
      if ((void *)CONCAT44(uStack_84,temp_witness_size) != (void *)0x0) {
        operator_delete((void *)CONCAT44(uStack_84,temp_witness_size));
      }
      if (cVar2 == '\0') {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&temp_witness_size,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(lVar3 + 0x90));
        cfd::core::ByteData256::IsEmpty();
        if ((void *)CONCAT44(uStack_84,temp_witness_size) != (void *)0x0) {
          operator_delete((void *)CONCAT44(uStack_84,temp_witness_size));
        }
      }
      lVar3 = lVar3 + 0x160;
    } while (lVar3 != local_58);
  }
  temp_witness_size = 0;
  temp_no_witness_size = 0;
  if (_txouts == local_40) {
    iVar4 = 0xb;
  }
  else {
    iVar4 = 0;
    bVar1 = (byte)local_94;
    iVar5 = 0;
    lVar3 = _txouts;
    do {
      cfd::core::ConfidentialTxOutReference::GetSerializeSize
                (SUB81(lVar3,0),(uint *)(ulong)bVar1,&temp_witness_size,(int)&temp_no_witness_size,
                 local_90,(uint *)(ulong)local_8c,0);
      iVar5 = iVar5 + temp_witness_size;
      iVar4 = iVar4 + temp_no_witness_size;
      lVar3 = lVar3 + 0xf8;
    } while (lVar3 != local_40);
    iVar4 = iVar4 + 0xb;
  }
  if (local_70 != (uint32_t *)0x0) {
    *local_70 = *local_70 + iVar5;
  }
  if (local_68 != (uint32_t *)0x0) {
    *local_68 = *local_68 + iVar4;
  }
  std::
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  ::~vector(&txins);
  std::
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  ::~vector(&txouts);
  return iVar4 + iVar5;
}

Assistant:

uint32_t ConfidentialTransactionController::GetSizeIgnoreTxIn(
    bool is_blinded, uint32_t* witness_area_size,
    uint32_t* no_witness_area_size, int exponent, int minimum_bits) const {
  uint32_t size = ConfidentialTransaction::kElementsTransactionMinimumSize;
  std::vector<ConfidentialTxOutReference> txouts = transaction_.GetTxOutList();
  std::vector<ConfidentialTxInReference> txins = transaction_.GetTxInList();

  uint32_t temp_asset_count = 0;

  // search vin from issue/reissue
  for (const auto& txin : txins) {
    if (!txin.GetAssetEntropy().IsEmpty()) {
      ++temp_asset_count;
      if (!txin.GetBlindingNonce().IsEmpty()) {
        // reissuance
      } else {
        ++temp_asset_count;  // issuance
      }
    }
    ++temp_asset_count;
  }

  uint32_t witness_size = 0;
  uint32_t no_witness_size = 0;
  uint32_t temp_witness_size = 0;
  uint32_t temp_no_witness_size = 0;
  for (const auto& txout : txouts) {
    txout.GetSerializeSize(
        is_blinded, &temp_witness_size, &temp_no_witness_size, exponent,
        minimum_bits, nullptr, temp_asset_count);
    witness_size += temp_witness_size;
    no_witness_size += temp_no_witness_size;
  }
  size += no_witness_size;

  if (witness_area_size != nullptr) {
    *witness_area_size += witness_size;
  }
  if (no_witness_area_size != nullptr) {
    *no_witness_area_size += size;
  }
  return size + witness_size;
}